

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnishingElementType::~IfcFurnishingElementType
          (IfcFurnishingElementType *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x60;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x60
       = 0x97dd08;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x48 =
       0x97ddd0;
  *(undefined8 *)
   &this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.HasPropertySets.have =
       0x97dd30;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf8
       = 0x97dd58;
  *(undefined8 *)&this[-1].super_IfcElementType.super_IfcTypeProduct.field_0x150 = 0x97dd80;
  *(undefined8 *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject = 0x97dda8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x10;
  if (puVar1 != &(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this_00,&PTR_construction_vtable_24__0097dbc8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcFurnishingElementType() : Object("IfcFurnishingElementType") {}